

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O0

c_int permute_KKT(csc **KKT,qdldl_solver *p,c_int Pnz,c_int Anz,c_int m,c_int *PtoKKT,c_int *AtoKKT,
                 c_int *rhotoKKT)

{
  void *__ptr;
  c_int *__ptr_00;
  csc *pcVar1;
  void *__ptr_01;
  long in_RCX;
  long in_RDX;
  long *in_RDI;
  long in_R8;
  long in_R9;
  c_int i;
  c_int *KtoPKPt;
  csc *KKT_temp;
  c_int *Pinv;
  c_int amd_status;
  c_float *info;
  longlong *in_stack_00000060;
  longlong *in_stack_00000068;
  c_int in_stack_00000080;
  c_int *in_stack_00000088;
  c_int *in_stack_00000090;
  csc *in_stack_00000098;
  long local_68;
  c_int in_stack_ffffffffffffffa0;
  c_int *in_stack_ffffffffffffffa8;
  longlong local_8;
  
  __ptr = malloc(0xa0);
  local_8 = amd_l_order((longlong)AtoKKT,in_stack_00000068,in_stack_00000060,(longlong *)KKT,
                        (c_float *)p,(c_float *)Pnz);
  if (local_8 < 0) {
    free(__ptr);
  }
  else {
    __ptr_00 = csc_pinv(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (((in_R9 == 0) && (KtoPKPt == (c_int *)0x0)) && (KKT_temp == (csc *)0x0)) {
      pcVar1 = csc_symperm(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
    }
    else {
      __ptr_01 = malloc(*(long *)(*(long *)(*in_RDI + 0x18) + *(long *)(*in_RDI + 0x10) * 8) << 3);
      pcVar1 = csc_symperm(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
      if (in_R9 != 0) {
        for (local_68 = 0; local_68 < in_RDX; local_68 = local_68 + 1) {
          *(undefined8 *)(in_R9 + local_68 * 8) =
               *(undefined8 *)((long)__ptr_01 + *(long *)(in_R9 + local_68 * 8) * 8);
        }
      }
      if (KtoPKPt != (c_int *)0x0) {
        for (local_68 = 0; local_68 < in_RCX; local_68 = local_68 + 1) {
          KtoPKPt[local_68] = *(c_int *)((long)__ptr_01 + KtoPKPt[local_68] * 8);
        }
      }
      if (KKT_temp != (csc *)0x0) {
        for (local_68 = 0; local_68 < in_R8; local_68 = local_68 + 1) {
          (&KKT_temp->nzmax)[local_68] =
               *(c_int *)((long)__ptr_01 + (&KKT_temp->nzmax)[local_68] * 8);
        }
      }
      free(__ptr_01);
    }
    csc_spfree((csc *)0x118755);
    *in_RDI = (long)pcVar1;
    free(__ptr_00);
    free(__ptr);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static c_int permute_KKT(csc ** KKT, qdldl_solver * p, c_int Pnz, c_int Anz, c_int m, c_int * PtoKKT, c_int * AtoKKT, c_int * rhotoKKT){
    c_float *info;
    c_int amd_status;
    c_int * Pinv;
    csc *KKT_temp;
    c_int * KtoPKPt;
    c_int i; // Indexing

    info = (c_float *)c_malloc(AMD_INFO * sizeof(c_float));

    // Compute permutation matrix P using AMD
#ifdef DLONG
    amd_status = amd_l_order((*KKT)->n, (*KKT)->p, (*KKT)->i, p->P, (c_float *)OSQP_NULL, info);
#else
    amd_status = amd_order((*KKT)->n, (*KKT)->p, (*KKT)->i, p->P, (c_float *)OSQP_NULL, info);
#endif
    if (amd_status < 0) {
        // Free Amd info and return an error
        c_free(info);
        return amd_status;
    }


    // Inverse of the permutation vector
    Pinv = csc_pinv(p->P, (*KKT)->n);

    // Permute KKT matrix
    if (!PtoKKT && !AtoKKT && !rhotoKKT){  // No vectors to be stored
        // Assign values of mapping
        KKT_temp = csc_symperm((*KKT), Pinv, OSQP_NULL, 1);
    }
    else {
        // Allocate vector of mappings from unpermuted to permuted
        KtoPKPt = c_malloc((*KKT)->p[(*KKT)->n] * sizeof(c_int));
        KKT_temp = csc_symperm((*KKT), Pinv, KtoPKPt, 1);

        // Update vectors PtoKKT, AtoKKT and rhotoKKT
        if (PtoKKT){
            for (i = 0; i < Pnz; i++){
                PtoKKT[i] = KtoPKPt[PtoKKT[i]];
            }
        }
        if (AtoKKT){
            for (i = 0; i < Anz; i++){
                AtoKKT[i] = KtoPKPt[AtoKKT[i]];
            }
        }
        if (rhotoKKT){
            for (i = 0; i < m; i++){
                rhotoKKT[i] = KtoPKPt[rhotoKKT[i]];
            }
        }

        // Cleanup vector of mapping
        c_free(KtoPKPt);
    }

    // Cleanup
    // Free previous KKT matrix and assign pointer to new one
    csc_spfree((*KKT));
    (*KKT) = KKT_temp;
    // Free Pinv
    c_free(Pinv);
    // Free Amd info
    c_free(info);

    return 0;
}